

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O0

void __thiscall (anonymous_namespace)::LineEdit::~LineEdit(LineEdit *this)

{
  LineEdit *in_stack_00000010;
  
  anon_unknown.dwarf_1ee485::LineEdit::~LineEdit(in_stack_00000010);
  return;
}

Assistant:

Q_OBJECT
public:
    LineEdit(QWidget* parent = nullptr)
        : QLineEdit(parent)
    {
        setContextMenuPolicy(Qt::NoContextMenu);
        connect(this, &LineEdit::returnPressed, this, &LineEdit::handleReturnPressed);
    }